

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O2

int main(int ac,char **av)

{
  char **str1;
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool clean;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char **__args;
  uv_loop_t *loop;
  ostream *poVar9;
  char *pcVar10;
  int iVar11;
  ulong uVar12;
  string *psVar13;
  cmake *this;
  ulong uVar14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool local_4c2;
  bool local_4c1;
  int local_4bc;
  allocator_type local_4aa;
  allocator<char> local_4a9;
  string local_4a8;
  string dir;
  string config;
  unsigned_long numJobs;
  undefined8 local_440;
  undefined1 local_438 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  string dir_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nativeOptions;
  CommandLineArguments args;
  cmake cm;
  
  cmsys::Encoding::CommandLineArguments::Main(&args,ac,av);
  uVar5 = cmsys::Encoding::CommandLineArguments::argc(&args);
  __args = cmsys::Encoding::CommandLineArguments::argv(&args);
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(*__args);
  if ((int)uVar5 < 2) {
LAB_0013b9d6:
    uVar5 = do_cmake(uVar5,__args);
    cmDynamicLoader::FlushCache();
    loop = uv_default_loop();
    uv_loop_close(loop);
    goto LAB_0013c6f1;
  }
  pcVar10 = __args[1];
  iVar6 = strcmp(pcVar10,"--build");
  if (iVar6 == 0) {
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&config,"Debug",(allocator<char> *)&cm);
    dir._M_dataplus._M_p = (pointer)&dir.field_2;
    dir._M_string_length = 0;
    dir.field_2._M_allocated_capacity = dir.field_2._M_allocated_capacity & 0xffffffffffffff00;
    nativeOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    nativeOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    nativeOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4c1 = cmsys::SystemTools::HasEnv("VERBOSE");
    local_4bc = -1;
    iVar6 = 1;
    iVar8 = 2;
    clean = false;
    bVar2 = false;
    bVar4 = false;
    while( true ) {
      dir_1._M_dataplus._M_p._0_4_ = iVar8;
      if ((int)uVar5 <= iVar8) break;
      str1 = __args + iVar8;
      if (iVar6 == 4) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &nativeOptions,str1);
        iVar6 = 4;
        goto LAB_0013bdf7;
      }
      bVar3 = cmHasLiteralPrefix<char_const*,3ul>(str1,(char (*) [3])"-j");
      if (bVar3) {
        if (iVar8 + 1 < (int)uVar5) {
          pcVar10 = __args[iVar8 + 1];
        }
        else {
          pcVar10 = (char *)0x0;
        }
        local_4bc = anon_unknown.dwarf_99d8::extract_job_number((int *)&dir_1,*str1,pcVar10,2);
LAB_0013bc7c:
        iVar6 = 0;
        if (local_4bc < 0) {
          dir._M_string_length = 0;
          *dir._M_dataplus._M_p = '\0';
        }
      }
      else {
        bVar3 = cmHasLiteralPrefix<char_const*,11ul>(str1,(char (*) [11])"--parallel");
        if (bVar3) {
          if (iVar8 + 1 < (int)uVar5) {
            pcVar10 = __args[iVar8 + 1];
          }
          else {
            pcVar10 = (char *)0x0;
          }
          local_4bc = anon_unknown.dwarf_99d8::extract_job_number((int *)&dir_1,*str1,pcVar10,10);
          goto LAB_0013bc7c;
        }
        pcVar10 = *str1;
        iVar7 = strcmp(pcVar10,"--target");
        if ((iVar7 == 0) ||
           (((cVar1 = *pcVar10, cVar1 == '-' && (pcVar10[1] == 't')) && (pcVar10[2] == '\0')))) {
LAB_0013bdf4:
          iVar6 = 2;
        }
        else {
          iVar7 = strcmp(pcVar10,"--config");
          if (iVar7 == 0) {
            iVar6 = 3;
          }
          else {
            iVar7 = strcmp(pcVar10,"--clean-first");
            iVar11 = 0;
            if (iVar7 == 0) {
              clean = true;
              iVar6 = iVar11;
            }
            else {
              iVar7 = strcmp(pcVar10,"--verbose");
              if ((iVar7 == 0) || (((cVar1 == '-' && (pcVar10[1] == 'v')) && (pcVar10[2] == '\0'))))
              {
                local_4c1 = true;
                iVar6 = iVar11;
              }
              else {
                iVar7 = strcmp(pcVar10,"--use-stderr");
                if (iVar7 != 0) {
                  if (((cVar1 == '-') && (pcVar10[1] == '-')) && (pcVar10[2] == '\0')) {
                    iVar6 = 4;
                  }
                  else if (iVar6 == 3) {
                    std::__cxx11::string::assign((char *)&config);
                    iVar6 = iVar11;
                  }
                  else {
                    if (iVar6 == 2) {
                      if (cVar1 == '\0') {
                        poVar9 = std::operator<<((ostream *)&std::cerr,"Warning: Argument number ");
                        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar8);
                        poVar9 = std::operator<<(poVar9," after --target option is empty.");
                        std::endl<char,std::char_traits<char>>(poVar9);
                        if (!bVar2) goto LAB_0013bddc;
                      }
                      else {
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*const&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&targets,str1);
                        iVar6 = strcmp(*str1,"clean");
                        bVar4 = (bool)(bVar4 | iVar6 != 0);
                        if (iVar6 != 0 && !bVar2) {
LAB_0013bddc:
                          bVar2 = false;
                          goto LAB_0013bdf4;
                        }
                      }
                      if (bVar4) {
                        poVar9 = std::operator<<((ostream *)&std::cerr,
                                                 "Error: Building \'clean\' and other targets together is not supported."
                                                );
                        std::endl<char,std::char_traits<char>>(poVar9);
                        dir._M_string_length = 0;
                        *dir._M_dataplus._M_p = '\0';
                        bVar2 = true;
                        bVar4 = true;
                      }
                      else {
                        bVar2 = true;
                        bVar4 = false;
                      }
                      goto LAB_0013bdf4;
                    }
                    if (iVar6 == 1) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&numJobs,pcVar10,(allocator<char> *)&local_4a8);
                      cmsys::SystemTools::CollapseFullPath((string *)&cm,(string *)&numJobs);
                      std::__cxx11::string::operator=((string *)&dir,(string *)&cm);
                      std::__cxx11::string::~string((string *)&cm);
                      std::__cxx11::string::~string((string *)&numJobs);
                      iVar6 = iVar11;
                    }
                    else {
                      poVar9 = std::operator<<((ostream *)&std::cerr,"Unknown argument ");
                      poVar9 = std::operator<<(poVar9,*str1);
                      std::endl<char,std::char_traits<char>>(poVar9);
                      dir._M_string_length = 0;
                      *dir._M_dataplus._M_p = '\0';
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_0013bdf7:
      iVar8 = (int)dir_1._M_dataplus._M_p + 1;
    }
    if (local_4bc == -1) {
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&cm.Generators.
                     super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)cm.Generators.
                            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      bVar4 = cmsys::SystemTools::GetEnv("CMAKE_BUILD_PARALLEL_LEVEL",(string *)&cm);
      if (bVar4) {
        if (cm.Generators.
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
          local_4bc = 0;
        }
        else {
          numJobs = 0;
          bVar4 = cmSystemTools::StringToULong
                            ((char *)cm.Generators.
                                     super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start,&numJobs);
          if (!bVar4) {
            poVar9 = std::operator<<((ostream *)&std::cerr,
                                     "\'CMAKE_BUILD_PARALLEL_LEVEL\' environment variable\n");
            poVar9 = std::operator<<(poVar9,"invalid number \'");
            poVar9 = std::operator<<(poVar9,(string *)&cm);
            std::operator<<(poVar9,"\' given.\n\n");
            dir._M_string_length = 0;
            *dir._M_dataplus._M_p = '\0';
            goto LAB_0013c5b5;
          }
          local_4bc = (int)numJobs;
        }
      }
      else {
LAB_0013c5b5:
        local_4bc = -1;
      }
      std::__cxx11::string::~string((string *)&cm);
    }
    if (dir._M_string_length == 0) {
      std::operator<<((ostream *)&std::cerr,
                      "Usage: cmake --build <dir> [options] [-- [native-options]]\nOptions:\n  <dir>          = Project binary directory to be built.\n  --parallel [<jobs>], -j [<jobs>]\n                 = Build in parallel using the given number of jobs. \n                   If <jobs> is omitted the native build tool\'s \n                   default number is used.\n                   The CMAKE_BUILD_PARALLEL_LEVEL environment variable\n                   specifies a default parallel level when this option\n                   is not given.\n  --target <tgt>..., -t <tgt>... \n                 = Build <tgt> instead of default targets.\n  --config <cfg> = For multi-configuration tools, choose <cfg>.\n  --clean-first  = Build target \'clean\' first, then build.\n                   (To clean only, use --target \'clean\'.)\n --verbose, -v   = Enable verbose output - if supported - including\n                   the build commands to be executed. \n  --             = Pass remaining options to the native tool.\n"
                     );
      uVar5 = 1;
    }
    else {
      cmake::cmake(&cm,RoleInternal,Project);
      local_440 = 0;
      local_438._8_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:531:5)>
           ::_M_invoke;
      local_438._0_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:531:5)>
           ::_M_manager;
      numJobs = (unsigned_long)&cm;
      cmSystemTools::SetMessageCallback((MessageCallback *)&numJobs);
      std::_Function_base::~_Function_base((_Function_base *)&numJobs);
      dir_1._M_string_length = 0;
      dir_1.field_2._8_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:534:26)>
           ::_M_invoke;
      dir_1.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:534:26)>
           ::_M_manager;
      dir_1._M_dataplus._M_p = (pointer)&cm;
      cmake::SetProgressCallback(&cm,(ProgressCallbackType *)&dir_1);
      std::_Function_base::~_Function_base((_Function_base *)&dir_1);
      uVar5 = cmake::Build(&cm,local_4bc,&dir,&targets,&config,&nativeOptions,clean,local_4c1);
      cmake::~cmake(&cm);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&nativeOptions);
    std::__cxx11::string::~string((string *)&dir);
    std::__cxx11::string::~string((string *)&config);
    this = (cmake *)&targets;
LAB_0013c6ec:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
  }
  else {
    iVar6 = strcmp(pcVar10,"--install");
    uVar14 = (ulong)uVar5;
    if (iVar6 == 0) {
      config._M_string_length = 0;
      dir._M_dataplus._M_p = (pointer)&dir.field_2;
      dir._M_string_length = 0;
      dir.field_2._M_allocated_capacity = dir.field_2._M_allocated_capacity & 0xffffffffffffff00;
      numJobs = (unsigned_long)local_438;
      local_440 = 0;
      config.field_2._M_local_buf[0] = '\0';
      local_438._0_8_ = local_438._0_8_ & 0xffffffffffffff00;
      dir_1._M_dataplus._M_p = (pointer)&dir_1.field_2;
      dir_1._M_string_length = 0;
      dir_1.field_2._M_allocated_capacity = dir_1.field_2._M_allocated_capacity & 0xffffffffffffff00
      ;
      config._M_dataplus._M_p = (pointer)&config.field_2;
      local_4c2 = cmsys::SystemTools::HasEnv("VERBOSE");
      iVar6 = 1;
      bVar4 = false;
      for (uVar12 = 2; uVar14 != uVar12; uVar12 = uVar12 + 1) {
        pcVar10 = __args[uVar12];
        iVar8 = strcmp(pcVar10,"--config");
        if (iVar8 == 0) {
          iVar6 = 2;
        }
        else {
          iVar8 = strcmp(pcVar10,"--component");
          if (iVar8 == 0) {
            iVar6 = 3;
          }
          else {
            iVar8 = strcmp(pcVar10,"--prefix");
            if (iVar8 == 0) {
              iVar6 = 4;
            }
            else {
              iVar8 = strcmp(pcVar10,"--strip");
              if (iVar8 == 0) {
                bVar4 = true;
                iVar6 = 0;
              }
              else {
                iVar8 = strcmp(pcVar10,"--verbose");
                if ((iVar8 == 0) ||
                   (((*pcVar10 == '-' && (pcVar10[1] == 'v')) && (pcVar10[2] == '\0')))) {
                  local_4c2 = true;
                  iVar6 = 0;
                }
                else if (iVar6 - 1U < 4) {
                  psVar13 = &dir;
                  switch(iVar6) {
                  case 1:
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&targets,pcVar10,(allocator<char> *)&nativeOptions);
                    cmsys::SystemTools::CollapseFullPath((string *)&cm,(string *)&targets);
                    std::__cxx11::string::operator=((string *)&dir_1,(string *)&cm);
                    std::__cxx11::string::~string((string *)&cm);
                    std::__cxx11::string::~string((string *)&targets);
                    iVar6 = 0;
                    goto LAB_0013c007;
                  case 2:
                    psVar13 = &config;
                    break;
                  case 4:
                    psVar13 = (string *)&numJobs;
                  }
                  std::__cxx11::string::assign((char *)psVar13);
                  iVar6 = 0;
                }
                else {
                  poVar9 = std::operator<<((ostream *)&std::cerr,"Unknown argument ");
                  poVar9 = std::operator<<(poVar9,__args[uVar12]);
                  std::endl<char,std::char_traits<char>>(poVar9);
                  dir_1._M_string_length = 0;
                  *dir_1._M_dataplus._M_p = '\0';
                }
              }
            }
          }
        }
LAB_0013c007:
      }
      if (dir_1._M_string_length == 0) {
        std::operator<<((ostream *)&std::cerr,
                        "Usage: cmake --install <dir> [options]\nOptions:\n  <dir>              = Project binary directory to install.\n  --config <cfg>     = For multi-configuration tools, choose <cfg>.\n  --component <comp> = Component-based install. Only install <comp>.\n  --prefix <prefix>  = The installation prefix CMAKE_INSTALL_PREFIX.\n  --strip            = Performing install/strip.\n  -v --verbose       = Enable verbose output.\n"
                       );
        uVar5 = 1;
      }
      else {
        cmake::cmake(&cm,RoleScript,Script);
        targets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        targets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:617:5)>
                      ::_M_manager;
        targets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&cm;
        cmSystemTools::SetMessageCallback((MessageCallback *)&targets);
        std::_Function_base::~_Function_base((_Function_base *)&targets);
        nativeOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        nativeOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:620:26)>
                      ::_M_manager;
        nativeOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&cm;
        cmake::SetProgressCallback(&cm,(ProgressCallbackType *)&nativeOptions);
        std::_Function_base::~_Function_base((_Function_base *)&nativeOptions);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a8,"",(allocator<char> *)&args_1);
        cmake::SetHomeDirectory(&cm,&local_4a8);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a8,"",(allocator<char> *)&args_1);
        cmake::SetHomeOutputDirectory(&cm,&local_4a8);
        std::__cxx11::string::~string((string *)&local_4a8);
        cm.DebugOutput = local_4c2;
        cm.CurrentWorkingMode = SCRIPT_MODE;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,*__args,&local_4a9);
        __l._M_len = 1;
        __l._M_array = &local_4a8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&args_1,__l,&local_4aa);
        std::__cxx11::string::~string((string *)&local_4a8);
        if (local_440 != 0) {
          std::operator+(&local_4a8,"-DCMAKE_INSTALL_PREFIX=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &numJobs);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                     &local_4a8);
          std::__cxx11::string::~string((string *)&local_4a8);
        }
        if (dir._M_string_length != 0) {
          std::operator+(&local_4a8,"-DCMAKE_INSTALL_COMPONENT=",&dir);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                     &local_4a8);
          std::__cxx11::string::~string((string *)&local_4a8);
        }
        if (bVar4) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[27]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                     (char (*) [27])"-DCMAKE_INSTALL_DO_STRIP=1");
        }
        if (config._M_string_length != 0) {
          std::operator+(&local_4a8,"-DCMAKE_INSTALL_CONFIG_NAME=",&config);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                     &local_4a8);
          std::__cxx11::string::~string((string *)&local_4a8);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                   (char (*) [3])0x3ee22d);
        std::operator+(&local_4a8,&dir_1,"/cmake_install.cmake");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                   &local_4a8);
        std::__cxx11::string::~string((string *)&local_4a8);
        iVar6 = cmake::Run(&cm,&args_1);
        uVar5 = (uint)(iVar6 != 0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&args_1);
        cmake::~cmake(&cm);
      }
      std::__cxx11::string::~string((string *)&dir_1);
      std::__cxx11::string::~string((string *)&numJobs);
      std::__cxx11::string::~string((string *)&dir);
    }
    else {
      iVar6 = strcmp(pcVar10,"--open");
      if (iVar6 != 0) {
        if (((*pcVar10 != '-') || (pcVar10[1] != 'E')) || (pcVar10[2] != '\0')) goto LAB_0013b9d6;
        cm.Generators.
        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        cm.Generators.
        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        cm.Generators.
        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cm,(ulong)(uVar5 - 1));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cm,__args);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<char_const*const*,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cm,
                   (const_iterator)
                   cm.Generators.
                   super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args + 2,__args + uVar14);
        uVar5 = cmcmd::ExecuteCMakeCommand
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&cm);
        this = &cm;
        goto LAB_0013c6ec;
      }
      uVar5 = 1;
      config._M_string_length = 0;
      config.field_2._M_local_buf[0] = '\0';
      bVar4 = true;
      config._M_dataplus._M_p = (pointer)&config.field_2;
      for (uVar12 = 2; uVar14 != uVar12; uVar12 = uVar12 + 1) {
        if (bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&dir,__args[uVar12],(allocator<char> *)&numJobs);
          cmsys::SystemTools::CollapseFullPath((string *)&cm,&dir);
          std::__cxx11::string::operator=((string *)&config,(string *)&cm);
          std::__cxx11::string::~string((string *)&cm);
          std::__cxx11::string::~string((string *)&dir);
        }
        else {
          poVar9 = std::operator<<((ostream *)&std::cerr,"Unknown argument ");
          poVar9 = std::operator<<(poVar9,__args[uVar12]);
          std::endl<char,std::char_traits<char>>(poVar9);
          config._M_string_length = 0;
          *config._M_dataplus._M_p = '\0';
        }
        bVar4 = false;
      }
      if (config._M_string_length == 0) {
        std::operator<<((ostream *)&std::cerr,"Usage: cmake --open <dir>\n");
      }
      else {
        cmake::cmake(&cm,RoleInternal,Unknown);
        dir._M_string_length = 0;
        dir.field_2._8_8_ =
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:686:5)>
             ::_M_invoke;
        dir.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:686:5)>
             ::_M_manager;
        dir._M_dataplus._M_p = (pointer)&cm;
        cmSystemTools::SetMessageCallback((MessageCallback *)&dir);
        std::_Function_base::~_Function_base((_Function_base *)&dir);
        local_440 = 0;
        local_438._8_8_ =
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:689:26)>
             ::_M_invoke;
        local_438._0_8_ =
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:689:26)>
             ::_M_manager;
        numJobs = (unsigned_long)&cm;
        cmake::SetProgressCallback(&cm,(ProgressCallbackType *)&numJobs);
        std::_Function_base::~_Function_base((_Function_base *)&numJobs);
        bVar4 = cmake::Open(&cm,&config,false);
        uVar5 = (uint)!bVar4;
        cmake::~cmake(&cm);
      }
    }
    std::__cxx11::string::~string((string *)&config);
  }
LAB_0013c6f1:
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&args);
  return uVar5;
}

Assistant:

int main(int ac, char const* const* av)
{
#if defined(_WIN32) && defined(CMAKE_BUILD_WITH_CMAKE)
  // Replace streambuf so we can output Unicode to console
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
  consoleOut.SetUTF8Pipes();
  cmsys::ConsoleBuf::Manager consoleErr(std::cerr, true);
  consoleErr.SetUTF8Pipes();
#endif
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  ac = args.argc();
  av = args.argv();

  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(av[0]);
  if (ac > 1) {
    if (strcmp(av[1], "--build") == 0) {
      return do_build(ac, av);
    }
    if (strcmp(av[1], "--install") == 0) {
      return do_install(ac, av);
    }
    if (strcmp(av[1], "--open") == 0) {
      return do_open(ac, av);
    }
    if (strcmp(av[1], "-E") == 0) {
      return do_command(ac, av);
    }
  }
  int ret = do_cmake(ac, av);
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDynamicLoader::FlushCache();
#endif
  uv_loop_close(uv_default_loop());
  return ret;
}